

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O0

int disasm_acall_offset(em8051 *aCPU,int aPosition,char *aBuffer)

{
  char *aBuffer_local;
  int aPosition_local;
  em8051 *aCPU_local;
  
  sprintf(aBuffer,"ACALL %04Xh",
          (ulong)(aPosition + 2U & 0xf800 |
                  (uint)aCPU->mCodeMem[(int)(aPosition + 1U & aCPU->mCodeMemSize - 1U)] |
                 (aCPU->mCodeMem[(int)(aPosition & aCPU->mCodeMemSize - 1U)] & 0xe0) << 3));
  return 2;
}

Assistant:

static int disasm_acall_offset(struct em8051 *aCPU, int aPosition, char *aBuffer)
{
    sprintf(aBuffer,"ACALL %04Xh",
        (aPosition + 2) & 0xf800 |
        aCPU->mCodeMem[(aPosition + 1)&(aCPU->mCodeMemSize-1)] | 
        ((aCPU->mCodeMem[(aPosition)&(aCPU->mCodeMemSize-1)] & 0xe0) << 3));
    return 2;
}